

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parse_type(fb_parser_t *P,fb_value_t *v)

{
  ulong uVar1;
  ushort uVar2;
  fb_token_t *pfVar3;
  long lVar4;
  unsigned_short uVar5;
  char *msg;
  fb_token_t *pfVar6;
  fb_token_t *pfVar7;
  uint uVar8;
  bool bVar9;
  anon_union_16_9_a0fedaf0_for_fb_value_0 local_48;
  short local_38;
  
  pfVar3 = P->token;
  v->len = 1;
  v->type = 1;
  uVar8 = 0;
  if (pfVar3->id == 0x5b) {
    uVar8 = 0;
    pfVar7 = pfVar3;
    do {
      next(P);
      if (pfVar7 == (fb_token_t *)0x0) break;
      uVar8 = uVar8 + 1;
      pfVar7 = P->token;
    } while (pfVar7->id == 0x5b);
  }
  if (1 < uVar8) {
    __flatcc_error_report
              (P,pfVar3,"vector type can only be one-dimensional",(fb_token_t *)0x0,(char *)0x0,0);
  }
  pfVar7 = P->token;
  lVar4 = pfVar7->id;
  uVar1 = lVar4 + 999;
  if (uVar1 < 0x1e) {
    if ((0x25fb4ff7UL >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 != 0x1b) goto LAB_00120644;
      (v->field_0).t = pfVar7;
      uVar5 = (uVar8 == 0) + 10;
    }
    else {
      (v->field_0).t = pfVar7;
      uVar5 = (uVar8 == 0) + 8;
    }
    v->type = uVar5;
    next(P);
  }
  else {
LAB_00120644:
    if (lVar4 == 9) {
      parse_ref(P,(fb_ref_t **)v);
      v->type = (uVar8 == 0) + 0xc;
    }
    else if (lVar4 == 0x5d) {
      __flatcc_fb_print_error(P,"error: %s\n","vector type cannot be empty");
      P->failed = P->failed + 1;
    }
    else {
      __flatcc_error_report(P,pfVar7,"invalid type specifier",(fb_token_t *)0x0,(char *)0x0,0);
    }
  }
  if (((uVar8 == 0) || (pfVar6 = P->token, pfVar6->id != 0x3a)) ||
     (next(P), pfVar6 == (fb_token_t *)0x0)) goto LAB_00120715;
  pfVar6 = P->token;
  parse_value(P,(fb_value_t *)&local_48.s,0,
              "fixed length array length expected to be an unsigned integer");
  if (local_38 == 6) {
    uVar2 = v->type;
    if (uVar2 < 10) {
      if (uVar2 == 1) goto LAB_00120715;
      uVar5 = 0x11;
      if (uVar2 != 8) {
LAB_001206c1:
        msg = "invalid fixed length array type";
        pfVar6 = pfVar7;
        goto LAB_00120702;
      }
    }
    else if (uVar2 == 10) {
      uVar5 = 0x13;
    }
    else {
      if (uVar2 != 0xc) goto LAB_001206c1;
      uVar5 = 0x12;
    }
    v->type = uVar5;
    if (local_48.s.s == (char *)0x0) {
      msg = "fixed length array length cannot be 0";
    }
    else {
      if (local_48.u >> 0x20 == 0) {
        v->len = (uint32_t)local_48.i;
        goto LAB_00120715;
      }
      msg = "fixed length array length overflow";
    }
  }
  else {
    msg = "fixed length array length expected to be an unsigned integer";
  }
LAB_00120702:
  __flatcc_error_report(P,pfVar6,msg,(fb_token_t *)0x0,(char *)0x0,0);
  v->type = 1;
LAB_00120715:
  do {
    pfVar6 = P->token;
    if ((pfVar6->id != 0x5d) || (next(P), pfVar6 == (fb_token_t *)0x0)) goto LAB_00120739;
    bVar9 = uVar8 != 0;
    uVar8 = uVar8 - 1;
  } while (bVar9);
  uVar8 = 0xffffffff;
LAB_00120739:
  if (uVar8 != 0) {
    __flatcc_error_report
              (P,(fb_token_t *)0x0,"vector type missing \']\' to match",pfVar3,(char *)0x0,0);
  }
  pfVar6 = P->token;
  if (pfVar6->id == 0x5d) {
    next(P);
  }
  else {
    pfVar6 = (fb_token_t *)0x0;
  }
  if (pfVar6 != (fb_token_t *)0x0) {
    __flatcc_error_report(P,pfVar6,"extra \']\' not matching",pfVar3,(char *)0x0,0);
    do {
      pfVar3 = P->token;
      if (pfVar3->id != 0x5d) break;
      next(P);
    } while (pfVar3 != (fb_token_t *)0x0);
  }
  if ((pfVar7->id == -0x3e5) && ((v->type | 0x10) != 0x11)) {
    __flatcc_error_report
              (P,pfVar7,"char can only be used as a fixed length array type [char:<n>]",
               (fb_token_t *)0x0,(char *)0x0,0);
    v->type = 1;
  }
  return;
}

Assistant:

static void parse_type(fb_parser_t *P, fb_value_t *v)
{
    fb_token_t *t = 0;
    fb_token_t *ttype = 0;
    fb_token_t *t0 = P->token;
    int vector = 0;

    v->len = 1;
    v->type = vt_invalid;
    while ((t = optional(P, '['))) {
        ++vector;
    }
    if (vector > 1) {
        error_tok(P, t0, "vector type can only be one-dimensional");
    }
    ttype = P->token;
    switch (ttype->id) {
    case tok_kw_int:
    case tok_kw_bool:
    case tok_kw_byte:
    case tok_kw_long:
    case tok_kw_uint:
    case tok_kw_float:
    case tok_kw_short:
    case tok_kw_char:
    case tok_kw_ubyte:
    case tok_kw_ulong:
    case tok_kw_ushort:
    case tok_kw_double:
    case tok_kw_int8:
    case tok_kw_int16:
    case tok_kw_int32:
    case tok_kw_int64:
    case tok_kw_uint8:
    case tok_kw_uint16:
    case tok_kw_uint32:
    case tok_kw_uint64:
    case tok_kw_float32:
    case tok_kw_float64:
        v->t = P->token;
        v->type = vector ? vt_vector_type : vt_scalar_type;
        next(P);
        break;
    case tok_kw_string:
        v->t = P->token;
        v->type = vector ? vt_vector_string_type : vt_string_type;
        next(P);
        break;
    case LEX_TOK_ID:
        parse_ref(P, &v->ref);
        v->type = vector ? vt_vector_type_ref : vt_type_ref;
        break;
    case ']':
        error_tok(P, t, "vector type cannot be empty");
        break;
    default:
        error_tok(P, ttype, "invalid type specifier");
        break;
    }
    if (vector && optional(P, ':')) {
        parse_fixed_array_size(P, ttype, v);
    }
    while (optional(P, ']') && vector--) {
    }
    if (vector) {
        error_tok_2(P, t, "vector type missing ']' to match", t0);
    }
    if ((t = optional(P, ']'))) {
        error_tok_2(P, t, "extra ']' not matching", t0);
        while (optional(P, ']')) {
        }
    }
    if (ttype->id == tok_kw_char && v->type != vt_invalid) {
        if (v->type != vt_fixed_array_type) {
            error_tok(P, ttype, "char can only be used as a fixed length array type [char:<n>]");
            v->type = vt_invalid;
        }
    }
}